

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_ManPrintMuxStats(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int local_20;
  uint local_1c;
  int nTotal;
  int nXors;
  int nMuxes;
  int nAnds;
  Gia_Man_t *p_local;
  
  _nMuxes = p;
  if (p->pMuxes == (uint *)0x0) {
    Gia_ManCountMuxXor(p,&nTotal,(int *)&local_1c);
    iVar1 = Gia_ManAndNotBufNum(_nMuxes);
    nXors = iVar1 + nTotal * -3 + local_1c * -3;
    local_20 = Gia_ManAndNotBufNum(_nMuxes);
  }
  else {
    iVar1 = Gia_ManAndNotBufNum(p);
    iVar2 = Gia_ManXorNum(_nMuxes);
    iVar3 = Gia_ManMuxNum(_nMuxes);
    nXors = (iVar1 - iVar2) - iVar3;
    local_1c = Gia_ManXorNum(_nMuxes);
    nTotal = Gia_ManMuxNum(_nMuxes);
    local_20 = nXors + local_1c * 3 + nTotal * 3;
  }
  Abc_Print(1,"stats:  ");
  Abc_Print(1,"xor =%8d %6.2f %%   ",((double)(int)local_1c * 300.0) / (double)local_20,
            (ulong)local_1c);
  Abc_Print(1,"mux =%8d %6.2f %%   ",((double)nTotal * 300.0) / (double)local_20,(ulong)(uint)nTotal
           );
  Abc_Print(1,"and =%8d %6.2f %%   ",((double)nXors * 100.0) / (double)local_20,(ulong)(uint)nXors);
  uVar4 = Gia_ManAndNotBufNum(_nMuxes);
  Abc_Print(1,"obj =%8d  ",(ulong)uVar4);
  fflush(_stdout);
  return;
}

Assistant:

void Gia_ManPrintMuxStats( Gia_Man_t * p )
{
    int nAnds, nMuxes, nXors, nTotal;
    if ( p->pMuxes )
    {
        nAnds  = Gia_ManAndNotBufNum(p)-Gia_ManXorNum(p)-Gia_ManMuxNum(p);
        nXors  = Gia_ManXorNum(p);
        nMuxes = Gia_ManMuxNum(p);
        nTotal = nAnds + 3*nXors + 3*nMuxes;
    }
    else 
    {
        Gia_ManCountMuxXor( p, &nMuxes, &nXors );
        nAnds  = Gia_ManAndNotBufNum(p) - 3*nMuxes - 3*nXors;
        nTotal = Gia_ManAndNotBufNum(p);
    }
    Abc_Print( 1, "stats:  " );
    Abc_Print( 1, "xor =%8d %6.2f %%   ", nXors,  300.0*nXors/nTotal );
    Abc_Print( 1, "mux =%8d %6.2f %%   ", nMuxes, 300.0*nMuxes/nTotal );
    Abc_Print( 1, "and =%8d %6.2f %%   ", nAnds,  100.0*nAnds/nTotal );
    Abc_Print( 1, "obj =%8d  ", Gia_ManAndNotBufNum(p) );
    fflush( stdout );
}